

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 c_v64_unpacklo_u8_s16(c_v64 a)

{
  uint uVar1;
  
  uVar1 = a.u32[0];
  return (c_v64)(a.u64 & 0xff | (ulong)(uVar1 & 0xff0000) << 0x10 |
                 (ulong)(uVar1 & 0xff000000) << 0x18 | (ulong)((uVar1 & 0xff00) << 8));
}

Assistant:

SIMD_INLINE c_v64 c_v64_unpacklo_u8_s16(c_v64 a) {
  c_v64 t;
  int endian = !!CONFIG_BIG_ENDIAN * 4;
  t.s16[3] = (int16_t)a.u8[3 + endian];
  t.s16[2] = (int16_t)a.u8[2 + endian];
  t.s16[1] = (int16_t)a.u8[1 + endian];
  t.s16[0] = (int16_t)a.u8[0 + endian];
  return t;
}